

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  
  plVar3 = (long *)stream->write_queue[0];
  if (stream->write_queue != (void **)plVar3) {
    do {
      lVar1 = *plVar3;
      *(long *)plVar3[1] = lVar1;
      *(long *)(lVar1 + 8) = plVar3[1];
      *(int *)((long)plVar3 + 0x24) = error;
      *plVar3 = (long)stream->write_completed_queue;
      puVar2 = (undefined8 *)stream->write_completed_queue[1];
      plVar3[1] = (long)puVar2;
      *puVar2 = plVar3;
      stream->write_completed_queue[1] = plVar3;
      plVar3 = (long *)stream->write_queue[0];
    } while (stream->write_queue != (void **)plVar3);
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  QUEUE* q;
  while (!QUEUE_EMPTY(&stream->write_queue)) {
    q = QUEUE_HEAD(&stream->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_write_t, queue);
    req->error = error;

    QUEUE_INSERT_TAIL(&stream->write_completed_queue, &req->queue);
  }
}